

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-client.c
# Opt level: O0

void ssh2_userauth_add_sigblob(ssh2_userauth_state *s,PktOut *pkt,ptrlen pkblob,ptrlen sigblob)

{
  _Bool _Var1;
  strbuf *buf;
  bool bVar2;
  ptrlen pVar3;
  strbuf *substr;
  void *local_108;
  void *local_100;
  void *local_f8;
  size_t sig_prefix_len;
  ptrlen sig_mp;
  ptrlen mod_mp;
  undefined1 local_98 [8];
  BinarySource sig [1];
  undefined1 local_68 [8];
  BinarySource pk [1];
  PktOut *pkt_local;
  ssh2_userauth_state *s_local;
  ptrlen sigblob_local;
  ptrlen pkblob_local;
  
  BinarySource_INIT__((BinarySource *)local_68,pkblob);
  BinarySource_INIT__((BinarySource *)local_98,sigblob);
  if (((s->ppl).remote_bugs & 0x10) != 0) {
    pVar3 = BinarySource_get_string((BinarySource *)pk[0]._24_8_);
    _Var1 = ptrlen_eq_string(pVar3,"ssh-rsa");
    if (_Var1) {
      pVar3 = BinarySource_get_string((BinarySource *)sig[0]._24_8_);
      _Var1 = ptrlen_eq_string(pVar3,"ssh-rsa");
      if (_Var1) {
        BinarySource_get_string((BinarySource *)pk[0]._24_8_);
        pVar3 = BinarySource_get_string((BinarySource *)pk[0]._24_8_);
        local_100 = pVar3.ptr;
        sig_mp.len = (size_t)local_100;
        local_f8 = (void *)pVar3.len;
        mod_mp.ptr = local_f8;
        pVar3 = BinarySource_get_string((BinarySource *)sig[0]._24_8_);
        local_108 = (void *)pVar3.len;
        if ((*(int *)(pk[0]._24_8_ + 0x18) == 0) && (*(int *)(sig[0]._24_8_ + 0x18) == 0)) {
          while( true ) {
            bVar2 = false;
            if (mod_mp.ptr != (void *)0x0) {
              bVar2 = *(char *)sig_mp.len == '\0';
            }
            if (!bVar2) break;
            mod_mp.ptr = (void *)((long)mod_mp.ptr + -1);
            sig_mp.len = sig_mp.len + 1;
          }
          if (local_108 < mod_mp.ptr) {
            buf = strbuf_new();
            BinarySink_put_data(buf->binarysink_,sigblob.ptr,(size_t)sig[0].data);
            BinarySink_put_uint32(buf->binarysink_,(unsigned_long)mod_mp.ptr);
            BinarySink_put_padding(buf->binarysink_,(long)mod_mp.ptr - (long)local_108,'\0');
            BinarySink_put_datapl(buf->binarysink_,pVar3);
            BinarySink_put_stringsb(pkt->binarysink_,buf);
            return;
          }
        }
      }
    }
  }
  BinarySink_put_stringpl(pkt->binarysink_,sigblob);
  return;
}

Assistant:

static void ssh2_userauth_add_sigblob(
    struct ssh2_userauth_state *s, PktOut *pkt, ptrlen pkblob, ptrlen sigblob)
{
    BinarySource pk[1], sig[1];
    BinarySource_BARE_INIT_PL(pk, pkblob);
    BinarySource_BARE_INIT_PL(sig, sigblob);

    /* dmemdump(pkblob, pkblob_len); */
    /* dmemdump(sigblob, sigblob_len); */

    /*
     * See if this is in fact an ssh-rsa signature and a buggy
     * server; otherwise we can just do this the easy way.
     */
    if ((s->ppl.remote_bugs & BUG_SSH2_RSA_PADDING) &&
        ptrlen_eq_string(get_string(pk), "ssh-rsa") &&
        ptrlen_eq_string(get_string(sig), "ssh-rsa")) {
        ptrlen mod_mp, sig_mp;
        size_t sig_prefix_len;

        /*
         * Find the modulus and signature integers.
         */
        get_string(pk);                /* skip over exponent */
        mod_mp = get_string(pk);       /* remember modulus */
        sig_prefix_len = sig->pos;
        sig_mp = get_string(sig);
        if (get_err(pk) || get_err(sig))
            goto give_up;

        /*
         * Find the byte length of the modulus, not counting leading
         * zeroes.
         */
        while (mod_mp.len > 0 && *(const char *)mod_mp.ptr == 0) {
            mod_mp.len--;
            mod_mp.ptr = (const char *)mod_mp.ptr + 1;
        }

        /* debug("modulus length is %d\n", len); */
        /* debug("signature length is %d\n", siglen); */

        if (mod_mp.len > sig_mp.len) {
            strbuf *substr = strbuf_new();
            put_data(substr, sigblob.ptr, sig_prefix_len);
            put_uint32(substr, mod_mp.len);
            put_padding(substr, mod_mp.len - sig_mp.len, 0);
            put_datapl(substr, sig_mp);
            put_stringsb(pkt, substr);
            return;
        }

        /* Otherwise fall through and do it the easy way. We also come
         * here as a fallback if we discover above that the key blob
         * is misformatted in some way. */
      give_up:;
    }

    put_stringpl(pkt, sigblob);
}